

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

ExpEmit __thiscall FxArrayElement::Emit(FxArrayElement *this,VMFunctionBuilder *build)

{
  byte bVar1;
  FxExpression *pFVar2;
  VMFunctionBuilder *this_00;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  PType *pPVar7;
  uint extraout_var;
  ExpEmit EVar8;
  ExpEmit EVar9;
  ulong uVar10;
  BYTE BVar11;
  ExpEmit EVar12;
  undefined4 uVar13;
  uint uVar14;
  ExpEmit indexwork;
  ExpEmit local_50;
  VMFunctionBuilder *local_48;
  ExpEmit indexv;
  anon_union_8_3_addc324a_for_ExpVal_1 local_38;
  uint extraout_var_00;
  
  pFVar2 = this->Array;
  pPVar7 = (PType *)&pFVar2->ValueType;
  if (this->arrayispointer == true) {
    pPVar7 = *(PType **)pPVar7 + 1;
  }
  pPVar7 = (PType *)(pPVar7->super_PTypeBase).super_DObject._vptr_DObject;
  EVar12._0_4_ = (*pFVar2->_vptr_FxExpression[9])(pFVar2,build);
  EVar12.Konst = (bool)(char)extraout_var;
  EVar12.Fixed = (bool)(char)(extraout_var >> 8);
  EVar12.Final = (bool)(char)(extraout_var >> 0x10);
  EVar12.Target = (bool)(char)(extraout_var >> 0x18);
  local_50 = EVar12;
  iVar3 = (*this->index->_vptr_FxExpression[3])();
  BVar11 = (BYTE)(EVar12._0_4_ >> 0x10);
  uVar14 = EVar12._2_4_;
  if ((char)iVar3 == '\0') {
    EVar8._0_4_ = (*this->index->_vptr_FxExpression[9])(this->index,build);
    EVar8.Konst = (bool)(char)extraout_var_00;
    EVar8.Fixed = (bool)(char)(extraout_var_00 >> 8);
    EVar8.Final = (bool)(char)(extraout_var_00 >> 0x10);
    EVar8.Target = (bool)(char)(extraout_var_00 >> 0x18);
    uVar5 = *(uint *)&pPVar7[1].super_PTypeBase.super_DObject.Class;
    indexv = EVar8;
    if (uVar5 < 0x10000) {
      iVar3 = 0x54;
    }
    else {
      uVar5 = VMFunctionBuilder::GetConstantInt(build,uVar5);
      iVar3 = 0x55;
    }
    VMFunctionBuilder::Emit(build,iVar3,EVar8._0_4_ & 0xffff,(VM_SHALF)uVar5);
    if ((extraout_var & 1) == 0) {
      uVar5 = *(uint *)((long)&pPVar7[1].super_PTypeBase.super_DObject.Class + 4);
      iVar3 = -1;
      do {
        iVar3 = iVar3 + 1;
        uVar6 = 1 << ((byte)iVar3 & 0x1f);
      } while (uVar6 < uVar5);
      uVar4 = EVar8._0_4_;
      indexwork = EVar8;
      local_48 = build;
      if ((1 < uVar5) && ((extraout_var_00 & 0x100) != 0)) {
        uVar4 = VMFunctionBuilder::RegAvailability::Get
                          (build->Registers + (((ulong)EVar8._0_4_ & 0xff0000) >> 0x10),1);
        indexwork.RegType = (uint8_t)(EVar8._0_4_ >> 0x10);
        indexwork.RegNum = (uint16_t)uVar4;
        indexwork.RegCount = '\x01';
        indexwork.Konst = false;
        indexwork.Fixed = false;
        indexwork.Final = false;
        indexwork.Target = false;
        uVar5 = *(uint *)((long)&pPVar7[1].super_PTypeBase.super_DObject.Class + 4);
      }
      this_00 = local_48;
      uVar4 = uVar4 & 0xffff;
      if (uVar6 == uVar5) {
        if (iVar3 != 0) {
          VMFunctionBuilder::Emit(local_48,0x5b,uVar4,EVar8._0_4_ & 0xffff,iVar3);
        }
      }
      else {
        uVar5 = VMFunctionBuilder::GetConstantInt(local_48,uVar5);
        VMFunctionBuilder::Emit(this_00,0x6a,uVar4,EVar8._0_4_ & 0xffff,uVar5);
      }
      ExpEmit::Free(&indexwork,this_00);
      if (this->AddressRequested == true) {
        if ((extraout_var >> 8 & 1) == 0) {
          VMFunctionBuilder::Emit(this_00,0xcc,EVar12._0_4_ & 0xffff,EVar12._0_4_ & 0xffff,uVar4);
        }
        else {
          ExpEmit::Free(&local_50,this_00);
          uVar5 = VMFunctionBuilder::RegAvailability::Get
                            (this_00->Registers + (((ulong)EVar12._0_4_ & 0xff0000) >> 0x10),1);
          VMFunctionBuilder::Emit(this_00,0xcc,uVar5 & 0xffff,EVar12._0_4_ & 0xffff,uVar4);
          EVar12 = (ExpEmit)((ulong)(uVar5 & 0xffff) | 0x1000000);
        }
        uVar10 = (ulong)EVar12 & 0xffffffff00000000;
        EVar9 = EVar12;
      }
      else {
        ExpEmit::Free(&local_50,this_00);
        bVar1 = ((this->super_FxExpression).ValueType)->RegType;
        uVar14 = (uint)bVar1;
        uVar5 = VMFunctionBuilder::RegAvailability::Get(this_00->Registers + bVar1,1);
        EVar9.Konst = false;
        EVar9.Fixed = false;
        EVar9.Final = false;
        EVar9.Target = false;
        EVar9.RegNum = (short)uVar5;
        EVar9.RegType = (char)(uVar5 >> 0x10);
        EVar9.RegCount = (char)(uVar5 >> 0x18);
        VMFunctionBuilder::Emit
                  (this_00,*(byte *)(pPVar7[1].super_PTypeBase.super_DObject._vptr_DObject + 0xd) +
                           1,uVar5 & 0xffff,EVar12._0_4_ & 0xffff,uVar4);
        EVar12.RegNum = 0;
        EVar12.RegType = '\0';
        EVar12.RegCount = '\x01';
        EVar12.Konst = false;
        EVar12.Fixed = false;
        EVar12.Final = false;
        EVar12.Target = false;
        uVar10 = 0;
      }
    }
    else {
      if (((this->super_FxExpression).ValueType)->RegType != BVar11) {
        __assert_fail("start.RegType == ValueType->GetRegType()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                      ,0x1ae5,"virtual ExpEmit FxArrayElement::Emit(VMFunctionBuilder *)");
      }
      uVar10 = ((ulong)EVar12._0_4_ & 0xff0000) >> 0x10;
      uVar5 = VMFunctionBuilder::RegAvailability::Get(build->Registers + uVar10,1);
      EVar9.Konst = false;
      EVar9.Fixed = false;
      EVar9.Final = false;
      EVar9.Target = false;
      EVar9.RegNum = (short)uVar5;
      EVar9.RegType = (char)(uVar5 >> 0x10);
      EVar9.RegCount = (char)(uVar5 >> 0x18);
      uVar6 = EVar12._0_4_ & 0xffff;
      if ((ushort)EVar12._0_4_ < 0x100) {
        iVar3 = Emit::LKR_Ops[uVar10];
      }
      else {
        uVar6 = VMFunctionBuilder::GetConstantInt(build,uVar6);
        VMFunctionBuilder::Emit(build,100,EVar8._0_4_ & 0xffff,EVar8._0_4_ & 0xffff,uVar6);
        iVar3 = Emit::LKR_Ops[uVar10];
        uVar6 = 0;
      }
      VMFunctionBuilder::Emit(build,iVar3,uVar5 & 0xffff,EVar8._0_4_ & 0xffff,uVar6);
      ExpEmit::Free(&indexv,build);
      EVar12.RegNum = 0;
      EVar12.RegType = '\0';
      EVar12.RegCount = '\x01';
      EVar12.Konst = false;
      EVar12.Fixed = false;
      EVar12.Final = false;
      EVar12.Target = false;
      uVar10 = 0;
    }
    uVar5 = EVar12._0_4_;
  }
  else {
    ExpVal::ExpVal((ExpVal *)&indexv,(ExpVal *)(this->index + 1));
    if (*(char *)((long)indexv + 0x6b) == '\x01') {
      uVar13 = (undefined4)(double)CONCAT44(local_38._4_4_,local_38.Int);
    }
    else {
      uVar13 = 0;
      if (*(char *)((long)indexv + 0x6b) == '\0') {
        uVar13 = local_38.Int;
      }
    }
    ExpVal::~ExpVal((ExpVal *)&indexv);
    if (*(uint *)&pPVar7[1].super_PTypeBase.super_DObject.Class <= (uint)uVar13) {
      __assert_fail("indexval < arraytype->ElementCount && \"Array index out of bounds\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                    ,0x1a7f,"virtual ExpEmit FxArrayElement::Emit(VMFunctionBuilder *)");
    }
    if (this->AddressRequested == true) {
      EVar9 = EVar12;
      if (uVar13 != 0) {
        iVar3 = uVar13 * *(int *)((long)&pPVar7[1].super_PTypeBase.super_DObject.Class + 4);
        if ((extraout_var >> 8 & 1) == 0) {
          uVar5 = VMFunctionBuilder::GetConstantInt(build,iVar3);
          VMFunctionBuilder::Emit(build,0xcd,EVar12._0_4_ & 0xffff,EVar12._0_4_ & 0xffff,uVar5);
        }
        else {
          uVar5 = VMFunctionBuilder::RegAvailability::Get
                            (build->Registers + (((ulong)EVar12._0_4_ & 0xff0000) >> 0x10),1);
          uVar6 = VMFunctionBuilder::GetConstantInt(build,iVar3);
          VMFunctionBuilder::Emit(build,0xcd,uVar5 & 0xffff,EVar12._0_4_ & 0xffff,uVar6);
          ExpEmit::Free(&local_50,build);
          EVar9 = (ExpEmit)((ulong)(uVar5 & 0xffff) | 0x1000000);
        }
      }
      uVar10 = (ulong)EVar9 & 0xffffffff00000000;
      uVar5 = EVar9._0_4_;
    }
    else if ((extraout_var & 1) == 0) {
      ExpEmit::Free(&local_50,build);
      bVar1 = ((this->super_FxExpression).ValueType)->RegType;
      uVar14 = (uint)bVar1;
      EVar9._0_4_ = VMFunctionBuilder::RegAvailability::Get(build->Registers + bVar1,1);
      EVar9.Konst = false;
      EVar9.Fixed = false;
      EVar9.Final = false;
      EVar9.Target = false;
      bVar1 = *(byte *)(pPVar7[1].super_PTypeBase.super_DObject._vptr_DObject + 0xd);
      uVar5 = VMFunctionBuilder::GetConstantInt
                        (build,uVar13 * *(int *)((long)&pPVar7[1].super_PTypeBase.super_DObject.
                                                        Class + 4));
      VMFunctionBuilder::Emit(build,(uint)bVar1,EVar9._0_4_ & 0xffff,EVar12._0_4_ & 0xffff,uVar5);
      uVar5 = 0x1000000;
      uVar10 = 0;
    }
    else {
      if (((this->super_FxExpression).ValueType)->RegType != BVar11) {
        __assert_fail("start.RegType == ValueType->GetRegType()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                      ,0x1a9f,"virtual ExpEmit FxArrayElement::Emit(VMFunctionBuilder *)");
      }
      uVar10 = ((ulong)EVar12._0_4_ & 0xff0000) >> 0x10;
      uVar5 = VMFunctionBuilder::RegAvailability::Get(build->Registers + uVar10,1);
      EVar9.Konst = false;
      EVar9.Fixed = false;
      EVar9.Final = false;
      EVar9.Target = false;
      EVar9.RegNum = (short)uVar5;
      EVar9.RegType = (char)(uVar5 >> 0x10);
      EVar9.RegCount = (char)(uVar5 >> 0x18);
      VMFunctionBuilder::Emit
                (build,Emit::LK_Ops[uVar10],uVar5 & 0xffff,(short)uVar13 + (ushort)EVar12._0_4_);
      uVar5 = 0x1000000;
      uVar10 = 0;
    }
  }
  return (ExpEmit)((ulong)EVar9 & 0xffff | (ulong)(uVar5 & 0xff000000) |
                  (uVar14 & 0xff) << 0x10 | uVar10);
}

Assistant:

ExpEmit FxArrayElement::Emit(VMFunctionBuilder *build)
{
	PArray *arraytype;
	
	if (arrayispointer)
	{
		arraytype = static_cast<PArray*>(static_cast<PPointer*>(Array->ValueType)->PointedType);
	}
	else
	{
		arraytype = static_cast<PArray*>(Array->ValueType);
	}
	ExpEmit start = Array->Emit(build);

	/* what was this for?
	if (start.Konst)
	{
		ExpEmit tmpstart(build, REGT_POINTER);
		build->Emit(OP_LKP, tmpstart.RegNum, start.RegNum);
		start.Free(build);
		start = tmpstart;
	}
	*/
	if (index->isConstant())
	{
		unsigned indexval = static_cast<FxConstant *>(index)->GetValue().GetInt();
		assert(indexval < arraytype->ElementCount && "Array index out of bounds");

		if (AddressRequested)
		{
			if (indexval != 0)
			{
				indexval *= arraytype->ElementSize;
				if (!start.Fixed)
				{
					build->Emit(OP_ADDA_RK, start.RegNum, start.RegNum, build->GetConstantInt(indexval));
				}
				else
				{
					// do not clobber local variables.
					ExpEmit temp(build, start.RegType);
					build->Emit(OP_ADDA_RK, temp.RegNum, start.RegNum, build->GetConstantInt(indexval));
					start.Free(build);
					start = temp;
				}
			}
			return start;
		}
		else if (!start.Konst)
		{
			start.Free(build);
			ExpEmit dest(build, ValueType->GetRegType());
			build->Emit(arraytype->ElementType->GetLoadOp(), dest.RegNum, start.RegNum, build->GetConstantInt(indexval* arraytype->ElementSize));
			return dest;
		}
		else
		{
			static int LK_Ops[] = { OP_LK, OP_LKF, OP_LKS, OP_LKP };
			assert(start.RegType == ValueType->GetRegType());
			ExpEmit dest(build, start.RegType);
			build->Emit(LK_Ops[start.RegType], dest.RegNum, start.RegNum + indexval);
			return dest;
		}
	}
	else
	{
		ExpEmit indexv(index->Emit(build));
		// Todo: For dynamically allocated arrays (like global sector and linedef tables) we need to get the bound value in here somehow.
		// Right now their bounds are not properly checked for.
		if (arraytype->ElementCount > 65535)
		{
			build->Emit(OP_BOUND_K, indexv.RegNum, build->GetConstantInt(arraytype->ElementCount));
		}
		else
		{
			build->Emit(OP_BOUND, indexv.RegNum, arraytype->ElementCount);
		}

		if (!start.Konst)
		{
			int shiftbits = 0;
			while (1u << shiftbits < arraytype->ElementSize)
			{
				shiftbits++;
			}
			ExpEmit indexwork = indexv.Fixed && arraytype->ElementSize > 1 ? ExpEmit(build, indexv.RegType) : indexv;
			if (1u << shiftbits == arraytype->ElementSize)
			{
				if (shiftbits > 0)
				{
					build->Emit(OP_SLL_RI, indexwork.RegNum, indexv.RegNum, shiftbits);
				}
			}
			else
			{
				// A shift won't do, so use a multiplication
				build->Emit(OP_MUL_RK, indexwork.RegNum, indexv.RegNum, build->GetConstantInt(arraytype->ElementSize));
			}
			indexwork.Free(build);

			if (AddressRequested)
			{
				if (!start.Fixed)
				{
					build->Emit(OP_ADDA_RR, start.RegNum, start.RegNum, indexwork.RegNum);
				}
				else
				{
					start.Free(build);
					// do not clobber local variables.
					ExpEmit temp(build, start.RegType);
					build->Emit(OP_ADDA_RR, temp.RegNum, start.RegNum, indexwork.RegNum);
					start = temp;
				}
				return start;
			}
			else
			{
				start.Free(build);
				ExpEmit dest(build, ValueType->GetRegType());
				// added 1 to use the *_R version that takes the offset from a register
				build->Emit(arraytype->ElementType->GetLoadOp() + 1, dest.RegNum, start.RegNum, indexwork.RegNum);
				return dest;
			}
		}
		else
		{
			static int LKR_Ops[] = { OP_LK_R, OP_LKF_R, OP_LKS_R, OP_LKP_R };
			assert(start.RegType == ValueType->GetRegType());
			ExpEmit dest(build, start.RegType);
			if (start.RegNum <= 255)
			{
				// Since large constant tables are the exception, the constant component in C is an immediate value here.
				build->Emit(LKR_Ops[start.RegType], dest.RegNum, indexv.RegNum, start.RegNum);
			}
			else
			{
				build->Emit(OP_ADD_RK, indexv.RegNum, indexv.RegNum, build->GetConstantInt(start.RegNum));
				build->Emit(LKR_Ops[start.RegType], dest.RegNum, indexv.RegNum, 0);
			}
			indexv.Free(build);
			return dest;
		}
	}
}